

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O0

bool __thiscall
QSQLiteResultPrivate::fetchNext
          (QSQLiteResultPrivate *this,ValueCache *values,int idx,bool initialFetch)

{
  bool bVar1;
  int iVar2;
  undefined4 uVar3;
  sqlite3_stmt *psVar4;
  qsizetype qVar5;
  reference pQVar6;
  reference this_00;
  char *pcVar7;
  sqlite3_int64 sVar8;
  QMetaType QVar9;
  QChar *pQVar10;
  ulong uVar11;
  byte in_CL;
  int in_EDX;
  QSQLiteResultPrivate *in_RDI;
  long in_FS_OFFSET;
  double dVar12;
  int i_1;
  int res;
  int i;
  QSQLiteResult *q;
  undefined4 in_stack_fffffffffffffd98;
  int in_stack_fffffffffffffd9c;
  undefined7 in_stack_fffffffffffffda0;
  undefined1 in_stack_fffffffffffffda7;
  QVariant *in_stack_fffffffffffffda8;
  sqlite3_stmt *in_stack_fffffffffffffdb0;
  sqlite3_stmt *psVar13;
  undefined8 in_stack_fffffffffffffdc0;
  sqlite3_stmt *in_stack_fffffffffffffdc8;
  sqlite3 *in_stack_fffffffffffffdd0;
  int local_1dc;
  int local_1d4;
  bool local_1a9;
  char local_1a8 [24];
  QSqlError local_190 [8];
  char local_188 [24];
  QSqlError local_170 [8];
  QString local_168;
  QByteArray local_150;
  undefined1 local_138 [24];
  undefined1 local_120 [24];
  undefined1 local_108 [24];
  QSqlError local_f0 [8];
  QVariant local_e8;
  QVariant local_c8;
  QVariant local_a8;
  QVariant local_88;
  QVariant local_68;
  QVariant local_48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = (bool)(in_CL & 1);
  psVar4 = (sqlite3_stmt *)q_func(in_RDI);
  if ((in_RDI->skipRow & 1U) != 0) {
    in_RDI->skipRow = false;
    for (local_1d4 = 0; qVar5 = QList<QVariant>::size(&in_RDI->firstRow), local_1d4 < qVar5;
        local_1d4 = local_1d4 + 1) {
      pQVar6 = QList<QVariant>::operator[]
                         ((QList<QVariant> *)
                          CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                          CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      this_00 = QList<QVariant>::operator[]
                          ((QList<QVariant> *)
                           CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                           CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
      QVariant::operator=(this_00,(QVariant *)pQVar6);
    }
    local_1a9 = (bool)(in_RDI->skippedStatus & 1);
    goto LAB_0011535b;
  }
  in_RDI->skipRow = bVar1;
  if (bVar1 != false) {
    QList<QVariant>::clear
              ((QList<QVariant> *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
    sqlite3_column_count(in_RDI->stmt);
    QList<QVariant>::resize
              ((QList<QVariant> *)in_stack_fffffffffffffdb0,(qsizetype)in_stack_fffffffffffffda8);
  }
  if (in_RDI->stmt == (sqlite3_stmt *)0x0) {
    QCoreApplication::translate(local_108,"QSQLiteResult","Unable to fetch row",0);
    QCoreApplication::translate(local_120,"QSQLiteResult","No query",0);
    QString::QString((QString *)0x114bef);
    QSqlError::QSqlError
              (local_f0,(QString *)local_108,(QString *)local_120,ConnectionError,
               (QString *)local_138);
    (**(code **)(*(long *)psVar4 + 0x28))(psVar4,local_f0);
    QSqlError::~QSqlError(local_f0);
    QString::~QString((QString *)0x114c46);
    QString::~QString((QString *)0x114c53);
    QString::~QString((QString *)0x114c60);
    (**(code **)(*(long *)psVar4 + 0x18))(psVar4,0xfffffffe);
    local_1a9 = false;
    goto LAB_0011535b;
  }
  iVar2 = sqlite3_step(in_stack_fffffffffffffdc8);
  if (iVar2 == 1) {
LAB_001151bd:
    sqlite3_reset(in_stack_fffffffffffffdb0);
    psVar13 = psVar4;
    drv_d_func((QSQLiteResultPrivate *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0)
              );
    QCoreApplication::translate(local_188,"QSQLiteResult","Unable to fetch row",0);
    qMakeError(in_stack_fffffffffffffdd0,(QString *)in_stack_fffffffffffffdc8,
               (ErrorType)((ulong)psVar13 >> 0x20),(int)psVar13);
    (**(code **)(*(long *)psVar13 + 0x28))(psVar13,local_170);
    QSqlError::~QSqlError(local_170);
    QString::~QString((QString *)0x115271);
    (**(code **)(*(long *)psVar4 + 0x18))(psVar4,0xfffffffe);
    local_1a9 = false;
  }
  else {
    if (iVar2 != 5) {
      if (iVar2 == 0x13) goto LAB_001151bd;
      if (iVar2 != 0x15) {
        if (iVar2 == 100) {
          uVar11 = QSqlRecord::isEmpty();
          if ((uVar11 & 1) != 0) {
            initColumns((QSQLiteResultPrivate *)in_stack_fffffffffffffdd0,
                        SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0));
          }
          if ((in_EDX < 0) && (bVar1 == false)) {
            local_1a9 = true;
          }
          else {
            for (local_1dc = 0; iVar2 = QSqlRecord::count(), local_1dc < iVar2;
                local_1dc = local_1dc + 1) {
              iVar2 = sqlite3_column_type((sqlite3_stmt *)
                                          CONCAT17(in_stack_fffffffffffffda7,
                                                   in_stack_fffffffffffffda0),
                                          in_stack_fffffffffffffd9c);
              switch(iVar2) {
              case 1:
                sVar8 = sqlite3_column_int64
                                  ((sqlite3_stmt *)
                                   CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                                   in_stack_fffffffffffffd9c);
                QVariant::QVariant(&local_48,sVar8);
                QList<QVariant>::operator[]
                          ((QList<QVariant> *)
                           CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                           CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
                QVariant::operator=(in_stack_fffffffffffffda8,
                                    (QVariant *)
                                    CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
                QVariant::~QVariant(&local_48);
                break;
              case 2:
                uVar3 = QSqlResult::numericalPrecisionPolicy();
                switch(uVar3) {
                case 0:
                case 4:
                default:
                  dVar12 = sqlite3_column_double
                                     ((sqlite3_stmt *)
                                      CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                                      in_stack_fffffffffffffd9c);
                  QVariant::QVariant(&local_a8,dVar12);
                  QList<QVariant>::operator[]
                            ((QList<QVariant> *)
                             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
                  QVariant::operator=(in_stack_fffffffffffffda8,
                                      (QVariant *)
                                      CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0))
                  ;
                  QVariant::~QVariant(&local_a8);
                  break;
                case 1:
                  iVar2 = sqlite3_column_int((sqlite3_stmt *)
                                             CONCAT17(in_stack_fffffffffffffda7,
                                                      in_stack_fffffffffffffda0),
                                             in_stack_fffffffffffffd9c);
                  QVariant::QVariant(&local_68,iVar2);
                  QList<QVariant>::operator[]
                            ((QList<QVariant> *)
                             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
                  QVariant::operator=(in_stack_fffffffffffffda8,
                                      (QVariant *)
                                      CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0))
                  ;
                  QVariant::~QVariant(&local_68);
                  break;
                case 2:
                  sVar8 = sqlite3_column_int64
                                    ((sqlite3_stmt *)
                                     CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                                     in_stack_fffffffffffffd9c);
                  QVariant::QVariant(&local_88,sVar8);
                  QList<QVariant>::operator[]
                            ((QList<QVariant> *)
                             CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                             CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
                  QVariant::operator=(in_stack_fffffffffffffda8,
                                      (QVariant *)
                                      CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0))
                  ;
                  QVariant::~QVariant(&local_88);
                }
                break;
              default:
                pQVar10 = (QChar *)sqlite3_column_text16
                                             ((sqlite3_stmt *)
                                              CONCAT17(in_stack_fffffffffffffda7,
                                                       in_stack_fffffffffffffda0),
                                              in_stack_fffffffffffffd9c);
                iVar2 = sqlite3_column_bytes16
                                  ((sqlite3_stmt *)
                                   CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                                   in_stack_fffffffffffffd9c);
                QString::QString(&local_168,pQVar10,(ulong)(long)iVar2 >> 1);
                QVariant::QVariant(&local_e8,(QString *)&local_168);
                QList<QVariant>::operator[]
                          ((QList<QVariant> *)
                           CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                           CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
                QVariant::operator=(in_stack_fffffffffffffda8,
                                    (QVariant *)
                                    CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
                QVariant::~QVariant(&local_e8);
                QString::~QString((QString *)0x115141);
                break;
              case 4:
                pcVar7 = (char *)sqlite3_column_blob((sqlite3_stmt *)
                                                     CONCAT17(in_stack_fffffffffffffda7,
                                                              in_stack_fffffffffffffda0),
                                                     in_stack_fffffffffffffd9c);
                iVar2 = sqlite3_column_bytes
                                  ((sqlite3_stmt *)
                                   CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                                   in_stack_fffffffffffffd9c);
                QByteArray::QByteArray(&local_150,pcVar7,(long)iVar2);
                QVariant::QVariant(&local_28,&local_150);
                QList<QVariant>::operator[]
                          ((QList<QVariant> *)
                           CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                           CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
                QVariant::operator=(in_stack_fffffffffffffda8,
                                    (QVariant *)
                                    CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
                QVariant::~QVariant(&local_28);
                QByteArray::~QByteArray((QByteArray *)0x114e5b);
                break;
              case 5:
                QVar9 = QMetaType::fromType<QString>();
                QVariant::QVariant(&local_c8,QVar9,(void *)0x0);
                QList<QVariant>::operator[]
                          ((QList<QVariant> *)
                           CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0),
                           CONCAT44(in_stack_fffffffffffffd9c,in_stack_fffffffffffffd98));
                QVariant::operator=(in_stack_fffffffffffffda8,
                                    (QVariant *)
                                    CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0));
                QVariant::~QVariant(&local_c8);
              }
            }
            local_1a9 = true;
          }
          goto LAB_0011535b;
        }
        if (iVar2 == 0x65) {
          uVar11 = QSqlRecord::isEmpty();
          if ((uVar11 & 1) != 0) {
            initColumns((QSQLiteResultPrivate *)in_stack_fffffffffffffdd0,
                        SUB81((ulong)in_stack_fffffffffffffdc8 >> 0x38,0));
          }
          (**(code **)(*(long *)psVar4 + 0x18))(psVar4,0xfffffffe);
          sqlite3_reset(in_stack_fffffffffffffdb0);
          local_1a9 = false;
          goto LAB_0011535b;
        }
      }
    }
    psVar13 = psVar4;
    drv_d_func((QSQLiteResultPrivate *)CONCAT17(in_stack_fffffffffffffda7,in_stack_fffffffffffffda0)
              );
    QCoreApplication::translate(local_1a8,"QSQLiteResult","Unable to fetch row",0);
    qMakeError(in_stack_fffffffffffffdd0,(QString *)in_stack_fffffffffffffdc8,
               (ErrorType)((ulong)in_stack_fffffffffffffdc0 >> 0x20),(int)in_stack_fffffffffffffdc0)
    ;
    (**(code **)(*(long *)psVar13 + 0x28))(psVar13,local_190);
    QSqlError::~QSqlError(local_190);
    QString::~QString((QString *)0x11532f);
    sqlite3_reset(psVar13);
    (**(code **)(*(long *)psVar4 + 0x18))(psVar4,0xfffffffe);
    local_1a9 = false;
  }
LAB_0011535b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_1a9;
  }
  __stack_chk_fail();
}

Assistant:

bool QSQLiteResultPrivate::fetchNext(QSqlCachedResult::ValueCache &values, int idx, bool initialFetch)
{
    Q_Q(QSQLiteResult);

    if (skipRow) {
        // already fetched
        Q_ASSERT(!initialFetch);
        skipRow = false;
        for(int i=0;i<firstRow.size();i++)
            values[i]=firstRow[i];
        return skippedStatus;
    }
    skipRow = initialFetch;

    if (initialFetch) {
        firstRow.clear();
        firstRow.resize(sqlite3_column_count(stmt));
    }

    if (!stmt) {
        q->setLastError(QSqlError(QCoreApplication::translate("QSQLiteResult", "Unable to fetch row"),
                                  QCoreApplication::translate("QSQLiteResult", "No query"), QSqlError::ConnectionError));
        q->setAt(QSql::AfterLastRow);
        return false;
    }
    int res = sqlite3_step(stmt);
    switch(res) {
    case SQLITE_ROW:
        // check to see if should fill out columns
        if (rInf.isEmpty())
            // must be first call.
            initColumns(false);
        if (idx < 0 && !initialFetch)
            return true;
        for (int i = 0; i < rInf.count(); ++i) {
            switch (sqlite3_column_type(stmt, i)) {
            case SQLITE_BLOB:
                values[i + idx] = QByteArray(static_cast<const char *>(
                            sqlite3_column_blob(stmt, i)),
                            sqlite3_column_bytes(stmt, i));
                break;
            case SQLITE_INTEGER:
                values[i + idx] = sqlite3_column_int64(stmt, i);
                break;
            case SQLITE_FLOAT:
                switch(q->numericalPrecisionPolicy()) {
                    case QSql::LowPrecisionInt32:
                        values[i + idx] = sqlite3_column_int(stmt, i);
                        break;
                    case QSql::LowPrecisionInt64:
                        values[i + idx] = sqlite3_column_int64(stmt, i);
                        break;
                    case QSql::LowPrecisionDouble:
                    case QSql::HighPrecision:
                    default:
                        values[i + idx] = sqlite3_column_double(stmt, i);
                        break;
                };
                break;
            case SQLITE_NULL:
                values[i + idx] = QVariant(QMetaType::fromType<QString>());
                break;
            default:
                values[i + idx] = QString(reinterpret_cast<const QChar *>(
                            sqlite3_column_text16(stmt, i)),
                            sqlite3_column_bytes16(stmt, i) / sizeof(QChar));
                break;
            }
        }
        return true;
    case SQLITE_DONE:
        if (rInf.isEmpty())
            // must be first call.
            initColumns(true);
        q->setAt(QSql::AfterLastRow);
        sqlite3_reset(stmt);
        return false;
    case SQLITE_CONSTRAINT:
    case SQLITE_ERROR:
        // SQLITE_ERROR is a generic error code and we must call sqlite3_reset()
        // to get the specific error message.
        res = sqlite3_reset(stmt);
        q->setLastError(qMakeError(drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                        "Unable to fetch row"), QSqlError::ConnectionError, res));
        q->setAt(QSql::AfterLastRow);
        return false;
    case SQLITE_MISUSE:
    case SQLITE_BUSY:
    default:
        // something wrong, don't get col info, but still return false
        q->setLastError(qMakeError(drv_d_func()->access, QCoreApplication::translate("QSQLiteResult",
                        "Unable to fetch row"), QSqlError::ConnectionError, res));
        sqlite3_reset(stmt);
        q->setAt(QSql::AfterLastRow);
        return false;
    }
    return false;
}